

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall
Uniforms::set(Uniforms *this,string *_name,vector<float,_std::allocator<float>_> *_data,bool _queue)

{
  pointer pfVar1;
  int iVar2;
  mapped_type *this_00;
  int iVar3;
  size_t sVar4;
  UniformValue value;
  
  pfVar1 = (_data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(_data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
  iVar2 = 4;
  if (iVar3 < 4) {
    iVar2 = iVar3;
  }
  for (sVar4 = 0; (long)iVar2 != sVar4; sVar4 = sVar4 + 1) {
    value._M_elems[sVar4] = pfVar1[sVar4];
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
            ::operator[](&this->data,_name);
  UniformData::set(this_00,&value,(long)iVar2,false,_queue);
  this->m_change = true;
  return;
}

Assistant:

void Uniforms::set( const std::string& _name, const std::vector<float>& _data, bool _queue) {
    UniformValue value;
    int N = std::min((int)_data.size(), 4);
    // memcpy(&value, _data.data(), N * sizeof(float) );
    for (size_t i = 0; i < N; i++)
        value[i] = _data[i];
    data[_name].set(value, N, false, _queue);
    m_change = true;
}